

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O0

istream * operator>>(istream *is,MTRand *mtrand)

{
  int local_24;
  MTRand *pMStack_20;
  int i;
  uint32 *s;
  MTRand *mtrand_local;
  istream *is_local;
  
  local_24 = 0x270;
  pMStack_20 = mtrand;
  while (local_24 != 0) {
    std::istream::operator>>(is,pMStack_20->state);
    local_24 = local_24 + -1;
    pMStack_20 = (MTRand *)(pMStack_20->state + 1);
  }
  std::istream::operator>>(is,&mtrand->left);
  mtrand->pNext = mtrand->state + (0x270 - mtrand->left);
  return is;
}

Assistant:

std::istream &operator>>(std::istream &is, MTRand &mtrand) {
  MTRand::uint32 *s = mtrand.state;
  int i = mtrand.N;
  for (; i--; is >> *s++) {
  }
  is >> mtrand.left;
  mtrand.pNext = &mtrand.state[mtrand.N - mtrand.left];
  return is;
}